

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O0

CURLcode Curl_sasl_continue(SASL *sasl,connectdata *conn,int code,saslprogress *progress)

{
  char *local_a0;
  char *local_98;
  char *local_90;
  size_t local_88;
  size_t len;
  char *service;
  size_t chlglen;
  char *chlg;
  char *serverdata;
  long port;
  char *hostname;
  char *resp;
  Curl_easy *pCStack_40;
  saslstate newstate;
  Curl_easy *data;
  saslprogress *psStack_30;
  CURLcode result;
  saslprogress *progress_local;
  connectdata *pcStack_20;
  int code_local;
  connectdata *conn_local;
  SASL *sasl_local;
  
  data._4_4_ = CURLE_OK;
  pCStack_40 = conn->data;
  resp._4_4_ = SASL_FINAL;
  hostname = (char *)0x0;
  if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
     (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
    local_90 = (conn->http_proxy).host.name;
  }
  else {
    local_90 = (conn->host).name;
  }
  port = (long)local_90;
  if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
     (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
    local_98 = (char *)conn->port;
  }
  else {
    local_98 = (char *)(long)conn->remote_port;
  }
  serverdata = local_98;
  chlglen = 0;
  service = (char *)0x0;
  if ((pCStack_40->set).str[0x32] == (char *)0x0) {
    local_a0 = sasl->params->service;
  }
  else {
    local_a0 = (pCStack_40->set).str[0x32];
  }
  len = (size_t)local_a0;
  local_88 = 0;
  *progress = SASL_INPROGRESS;
  psStack_30 = progress;
  progress_local._4_4_ = code;
  pcStack_20 = conn;
  conn_local = (connectdata *)sasl;
  if (sasl->state == SASL_FINAL) {
    if (code != sasl->params->finalcode) {
      data._4_4_ = CURLE_LOGIN_DENIED;
    }
    *progress = SASL_DONE;
    state(sasl,conn,SASL_STOP);
    sasl_local._4_4_ = data._4_4_;
  }
  else if (((sasl->state == SASL_CANCEL) || (sasl->state == SASL_OAUTH2_RESP)) ||
          (code == sasl->params->contcode)) {
    switch(sasl->state) {
    case SASL_STOP:
      *progress = SASL_DONE;
      return CURLE_OK;
    case SASL_PLAIN:
      data._4_4_ = Curl_auth_create_plain_message
                             (pCStack_40,conn->user,conn->passwd,&hostname,&local_88);
      break;
    case SASL_LOGIN:
      data._4_4_ = Curl_auth_create_login_message(pCStack_40,conn->user,&hostname,&local_88);
      resp._4_4_ = SASL_LOGIN_PASSWD;
      break;
    case SASL_LOGIN_PASSWD:
      data._4_4_ = Curl_auth_create_login_message(pCStack_40,conn->passwd,&hostname,&local_88);
      break;
    case SASL_EXTERNAL:
      data._4_4_ = Curl_auth_create_external_message(pCStack_40,conn->user,&hostname,&local_88);
      break;
    case SASL_CRAMMD5:
      (*sasl->params->getmessage)((pCStack_40->state).buffer,&chlg);
      data._4_4_ = Curl_auth_decode_cram_md5_message(chlg,(char **)&chlglen,(size_t *)&service);
      if (data._4_4_ == CURLE_OK) {
        data._4_4_ = Curl_auth_create_cram_md5_message
                               (pCStack_40,(char *)chlglen,pcStack_20->user,pcStack_20->passwd,
                                &hostname,&local_88);
      }
      (*Curl_cfree)((void *)chlglen);
      break;
    case SASL_DIGESTMD5:
      (*sasl->params->getmessage)((pCStack_40->state).buffer,&chlg);
      data._4_4_ = Curl_auth_create_digest_md5_message
                             (pCStack_40,chlg,pcStack_20->user,pcStack_20->passwd,(char *)len,
                              &hostname,&local_88);
      resp._4_4_ = SASL_DIGESTMD5_RESP;
      break;
    case SASL_DIGESTMD5_RESP:
      hostname = (*Curl_cstrdup)("");
      if (hostname == (char *)0x0) {
        data._4_4_ = CURLE_OUT_OF_MEMORY;
      }
      break;
    case SASL_NTLM:
      data._4_4_ = Curl_auth_create_ntlm_type1_message
                             (conn->user,conn->passwd,&conn->ntlm,&hostname,&local_88);
      resp._4_4_ = SASL_NTLM_TYPE2MSG;
      break;
    case SASL_NTLM_TYPE2MSG:
      (*sasl->params->getmessage)((pCStack_40->state).buffer,&chlg);
      data._4_4_ = Curl_auth_decode_ntlm_type2_message(pCStack_40,chlg,&pcStack_20->ntlm);
      if (data._4_4_ == CURLE_OK) {
        data._4_4_ = Curl_auth_create_ntlm_type3_message
                               (pCStack_40,pcStack_20->user,pcStack_20->passwd,&pcStack_20->ntlm,
                                &hostname,&local_88);
      }
      break;
    default:
      Curl_failf(pCStack_40,"Unsupported SASL authentication mechanism");
      data._4_4_ = CURLE_UNSUPPORTED_PROTOCOL;
      break;
    case SASL_OAUTH2:
      if (sasl->authused == 0x100) {
        data._4_4_ = Curl_auth_create_oauth_bearer_message
                               (pCStack_40,conn->user,local_90,(long)local_98,conn->oauth_bearer,
                                &hostname,&local_88);
        resp._4_4_ = SASL_OAUTH2_RESP;
      }
      else {
        data._4_4_ = Curl_auth_create_oauth_bearer_message
                               (pCStack_40,conn->user,(char *)0x0,0,conn->oauth_bearer,&hostname,
                                &local_88);
      }
      break;
    case SASL_OAUTH2_RESP:
      if (code == sasl->params->finalcode) {
        *progress = SASL_DONE;
        state(sasl,conn,SASL_STOP);
        return data._4_4_;
      }
      if (code != sasl->params->contcode) {
        *progress = SASL_DONE;
        state(sasl,conn,SASL_STOP);
        return CURLE_LOGIN_DENIED;
      }
      hostname = (*Curl_cstrdup)("AQ==");
      if (hostname == (char *)0x0) {
        data._4_4_ = CURLE_OUT_OF_MEMORY;
      }
      break;
    case SASL_CANCEL:
      sasl->authmechs = sasl->authused ^ sasl->authmechs;
      data._4_4_ = Curl_sasl_start(sasl,conn,(_Bool)(sasl->force_ir & 1),progress);
      resp._4_4_ = *(saslstate *)(conn_local->chunk).hexbuffer;
    }
    if (data._4_4_ == CURLE_OK) {
      if (hostname != (char *)0x0) {
        data._4_4_ = (**(code **)&(conn_local->data->msg).extmsg)(pcStack_20,hostname);
      }
    }
    else if (data._4_4_ == CURLE_BAD_CONTENT_ENCODING) {
      data._4_4_ = (**(code **)&(conn_local->data->msg).extmsg)(pcStack_20,"*");
      resp._4_4_ = SASL_CANCEL;
    }
    else {
      resp._4_4_ = SASL_STOP;
      *psStack_30 = SASL_DONE;
    }
    (*Curl_cfree)(hostname);
    state((SASL *)conn_local,pcStack_20,resp._4_4_);
    sasl_local._4_4_ = data._4_4_;
  }
  else {
    *progress = SASL_DONE;
    state(sasl,conn,SASL_STOP);
    sasl_local._4_4_ = CURLE_LOGIN_DENIED;
  }
  return sasl_local._4_4_;
}

Assistant:

CURLcode Curl_sasl_continue(struct SASL *sasl, struct connectdata *conn,
                            int code, saslprogress *progress)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  saslstate newstate = SASL_FINAL;
  char *resp = NULL;
  const char * const hostname = SSL_IS_PROXY() ? conn->http_proxy.host.name :
    conn->host.name;
  const long int port = SSL_IS_PROXY() ? conn->port : conn->remote_port;
#if !defined(CURL_DISABLE_CRYPTO_AUTH)
  char *serverdata;
  char *chlg = NULL;
  size_t chlglen = 0;
#endif
#if !defined(CURL_DISABLE_CRYPTO_AUTH) || defined(USE_KERBEROS5)
  const char *service = data->set.str[STRING_SERVICE_NAME] ?
                        data->set.str[STRING_SERVICE_NAME] :
                        sasl->params->service;
#endif
  size_t len = 0;

  *progress = SASL_INPROGRESS;

  if(sasl->state == SASL_FINAL) {
    if(code != sasl->params->finalcode)
      result = CURLE_LOGIN_DENIED;
    *progress = SASL_DONE;
    state(sasl, conn, SASL_STOP);
    return result;
  }

  if(sasl->state != SASL_CANCEL && sasl->state != SASL_OAUTH2_RESP &&
     code != sasl->params->contcode) {
    *progress = SASL_DONE;
    state(sasl, conn, SASL_STOP);
    return CURLE_LOGIN_DENIED;
  }

  switch(sasl->state) {
  case SASL_STOP:
    *progress = SASL_DONE;
    return result;
  case SASL_PLAIN:
    result = Curl_auth_create_plain_message(data, conn->user, conn->passwd,
                                            &resp,
                                            &len);
    break;
  case SASL_LOGIN:
    result = Curl_auth_create_login_message(data, conn->user, &resp, &len);
    newstate = SASL_LOGIN_PASSWD;
    break;
  case SASL_LOGIN_PASSWD:
    result = Curl_auth_create_login_message(data, conn->passwd, &resp, &len);
    break;
  case SASL_EXTERNAL:
    result = Curl_auth_create_external_message(data, conn->user, &resp, &len);
    break;

#ifndef CURL_DISABLE_CRYPTO_AUTH
  case SASL_CRAMMD5:
    sasl->params->getmessage(data->state.buffer, &serverdata);
    result = Curl_auth_decode_cram_md5_message(serverdata, &chlg, &chlglen);
    if(!result)
      result = Curl_auth_create_cram_md5_message(data, chlg, conn->user,
                                                 conn->passwd, &resp, &len);
    free(chlg);
    break;
  case SASL_DIGESTMD5:
    sasl->params->getmessage(data->state.buffer, &serverdata);
    result = Curl_auth_create_digest_md5_message(data, serverdata,
                                                 conn->user, conn->passwd,
                                                 service,
                                                 &resp, &len);
    newstate = SASL_DIGESTMD5_RESP;
    break;
  case SASL_DIGESTMD5_RESP:
    resp = strdup("");
    if(!resp)
      result = CURLE_OUT_OF_MEMORY;
    break;
#endif

#ifdef USE_NTLM
  case SASL_NTLM:
    /* Create the type-1 message */
    result = Curl_auth_create_ntlm_type1_message(conn->user, conn->passwd,
                                                 &conn->ntlm, &resp, &len);
    newstate = SASL_NTLM_TYPE2MSG;
    break;
  case SASL_NTLM_TYPE2MSG:
    /* Decode the type-2 message */
    sasl->params->getmessage(data->state.buffer, &serverdata);
    result = Curl_auth_decode_ntlm_type2_message(data, serverdata,
                                                 &conn->ntlm);
    if(!result)
      result = Curl_auth_create_ntlm_type3_message(data, conn->user,
                                                   conn->passwd, &conn->ntlm,
                                                   &resp, &len);
    break;
#endif

#if defined(USE_KERBEROS5)
  case SASL_GSSAPI:
    result = Curl_auth_create_gssapi_user_message(data, conn->user,
                                                  conn->passwd,
                                                  service,
                                                  data->easy_conn->host.name,
                                                  sasl->mutual_auth, NULL,
                                                  &conn->krb5,
                                                  &resp, &len);
    newstate = SASL_GSSAPI_TOKEN;
    break;
  case SASL_GSSAPI_TOKEN:
    sasl->params->getmessage(data->state.buffer, &serverdata);
    if(sasl->mutual_auth) {
      /* Decode the user token challenge and create the optional response
         message */
      result = Curl_auth_create_gssapi_user_message(data, NULL, NULL,
                                                    NULL, NULL,
                                                    sasl->mutual_auth,
                                                    serverdata, &conn->krb5,
                                                    &resp, &len);
      newstate = SASL_GSSAPI_NO_DATA;
    }
    else
      /* Decode the security challenge and create the response message */
      result = Curl_auth_create_gssapi_security_message(data, serverdata,
                                                        &conn->krb5,
                                                        &resp, &len);
    break;
  case SASL_GSSAPI_NO_DATA:
    sasl->params->getmessage(data->state.buffer, &serverdata);
    /* Decode the security challenge and create the response message */
    result = Curl_auth_create_gssapi_security_message(data, serverdata,
                                                      &conn->krb5,
                                                      &resp, &len);
    break;
#endif

  case SASL_OAUTH2:
    /* Create the authorisation message */
    if(sasl->authused == SASL_MECH_OAUTHBEARER) {
      result = Curl_auth_create_oauth_bearer_message(data, conn->user,
                                                     hostname,
                                                     port,
                                                     conn->oauth_bearer,
                                                     &resp, &len);

      /* Failures maybe sent by the server as continuations for OAUTHBEARER */
      newstate = SASL_OAUTH2_RESP;
    }
    else
      result = Curl_auth_create_oauth_bearer_message(data, conn->user,
                                                     NULL, 0,
                                                     conn->oauth_bearer,
                                                     &resp, &len);
    break;

  case SASL_OAUTH2_RESP:
    /* The continuation is optional so check the response code */
    if(code == sasl->params->finalcode) {
      /* Final response was received so we are done */
      *progress = SASL_DONE;
      state(sasl, conn, SASL_STOP);
      return result;
    }
    else if(code == sasl->params->contcode) {
      /* Acknowledge the continuation by sending a 0x01 response base64
         encoded */
      resp = strdup("AQ==");
      if(!resp)
        result = CURLE_OUT_OF_MEMORY;
      break;
    }
    else {
      *progress = SASL_DONE;
      state(sasl, conn, SASL_STOP);
      return CURLE_LOGIN_DENIED;
    }

  case SASL_CANCEL:
    /* Remove the offending mechanism from the supported list */
    sasl->authmechs ^= sasl->authused;

    /* Start an alternative SASL authentication */
    result = Curl_sasl_start(sasl, conn, sasl->force_ir, progress);
    newstate = sasl->state;   /* Use state from Curl_sasl_start() */
    break;
  default:
    failf(data, "Unsupported SASL authentication mechanism");
    result = CURLE_UNSUPPORTED_PROTOCOL;  /* Should not happen */
    break;
  }

  switch(result) {
  case CURLE_BAD_CONTENT_ENCODING:
    /* Cancel dialog */
    result = sasl->params->sendcont(conn, "*");
    newstate = SASL_CANCEL;
    break;
  case CURLE_OK:
    if(resp)
      result = sasl->params->sendcont(conn, resp);
    break;
  default:
    newstate = SASL_STOP;    /* Stop on error */
    *progress = SASL_DONE;
    break;
  }

  free(resp);

  state(sasl, conn, newstate);

  return result;
}